

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool (anonymous_namespace)::miniz::mz_zip_array_ensure_capacity
                  (mz_zip_archive *pZip,mz_zip_array *pArray,size_t min_new_capacity,mz_uint growing
                  )

{
  long lVar1;
  int in_ECX;
  ulong in_RDX;
  long *in_RSI;
  long in_RDI;
  size_t new_capacity;
  void *pNew_p;
  ulong local_40;
  ulong local_38;
  mz_bool local_4;
  
  if ((int)in_RSI[3] == 0) {
    __assert_fail("pArray->m_element_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                  ,0x1184,
                  "mz_bool (anonymous namespace)::miniz::mz_zip_array_ensure_capacity(mz_zip_archive *, mz_zip_array *, size_t, mz_uint)"
                 );
  }
  if ((ulong)in_RSI[2] < in_RDX) {
    local_38 = in_RDX;
    if (in_ECX != 0) {
      if (in_RSI[2] == 0) {
        local_40 = 1;
      }
      else {
        local_40 = in_RSI[2];
      }
      for (local_38 = local_40; local_38 < in_RDX; local_38 = local_38 << 1) {
      }
    }
    lVar1 = (**(code **)(in_RDI + 0x30))
                      (*(undefined8 *)(in_RDI + 0x38),*in_RSI,(int)in_RSI[3],local_38);
    if (lVar1 == 0) {
      local_4 = 0;
    }
    else {
      *in_RSI = lVar1;
      in_RSI[2] = local_38;
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static mz_bool mz_zip_array_ensure_capacity(mz_zip_archive *pZip,
                                            mz_zip_array *pArray,
                                            size_t min_new_capacity,
                                            mz_uint growing) {
  void *pNew_p;
  size_t new_capacity = min_new_capacity;
  MZ_ASSERT(pArray->m_element_size);
  if (pArray->m_capacity >= min_new_capacity)
    return MZ_TRUE;
  if (growing) {
    new_capacity = MZ_MAX(1, pArray->m_capacity);
    while (new_capacity < min_new_capacity)
      new_capacity *= 2;
  }
  if (NULL == (pNew_p = pZip->m_pRealloc(pZip->m_pAlloc_opaque, pArray->m_p,
                                         pArray->m_element_size, new_capacity)))
    return MZ_FALSE;
  pArray->m_p = pNew_p;
  pArray->m_capacity = new_capacity;
  return MZ_TRUE;
}